

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

apx_error_t
state_parse_data_signature
          (apx_parse_state_t *self,apx_signatureParser_t *parser,uint8_t *begin,uint8_t *end)

{
  apx_error_t aVar1;
  uint8_t *puVar2;
  apx_dataElement_t *paVar3;
  
  puVar2 = apx_signatureParser_parse_data_signature(parser,begin,end);
  if (puVar2 <= begin) {
    aVar1 = apx_signatureParser_get_last_error(parser,(uint8_t **)0x0);
    return aVar1;
  }
  aVar1 = 0x3f;
  if (puVar2 == end) {
    paVar3 = apx_signatureParser_take_data_element(parser);
    self->data_element = paVar3;
    aVar1 = 0;
    if (paVar3 == (apx_dataElement_t *)0x0) {
      __assert_fail("self->data_element != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/parser.c"
                    ,0x120,
                    "apx_error_t state_parse_data_signature(apx_parse_state_t *, apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                   );
    }
  }
  return aVar1;
}

Assistant:

static apx_error_t state_parse_data_signature(apx_parse_state_t* self, apx_signatureParser_t *parser, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* result = apx_signatureParser_parse_data_signature(parser, begin, end);
   if (result > begin)
   {
      if (result == end)
      {
         self->data_element = apx_signatureParser_take_data_element(parser);
         assert(self->data_element != NULL);
      }
      else
      {
         return APX_STRAY_CHARACTERS_AFTER_PARSE_ERROR;
      }
      return APX_NO_ERROR;
   }
   return apx_signatureParser_get_last_error(parser, NULL);
}